

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  bool local_19;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsDLLPlatform(this);
  local_19 = false;
  if (bVar1) {
    TVar2 = GetType(this);
    if ((TVar2 != SHARED_LIBRARY) && (bVar1 = IsExecutableWithExports(this), !bVar1)) {
      return false;
    }
    MVar3 = GetManagedType(this,config);
    local_19 = MVar3 != Managed;
  }
  return local_19;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed);
}